

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O0

void cswap(int n,complex<float> *cx,int incx,complex<float> *cy,int incy)

{
  _ComplexT_conflict _Var1;
  int local_40;
  int local_3c;
  int iy;
  int ix;
  int i;
  complex<float> ctemp;
  int incy_local;
  complex<float> *cy_local;
  int incx_local;
  complex<float> *cx_local;
  int n_local;
  
  ctemp._M_value._0_4_ = incy;
  unique0x100000f3 = cy;
  std::complex<float>::complex((complex<float> *)&ix,0.0,0.0);
  if (0 < n) {
    if ((incx == 1) && ((int)ctemp._M_value == 1)) {
      for (iy = 0; iy < n; iy = iy + 1) {
        _Var1 = cx[iy]._M_value;
        cx[iy]._M_value = stack0xffffffffffffffd8[iy]._M_value;
        stack0xffffffffffffffd8[iy]._M_value = _Var1;
      }
    }
    else {
      if (incx < 0) {
        local_3c = (1 - n) * incx;
      }
      else {
        local_3c = 0;
      }
      if ((int)ctemp._M_value < 0) {
        local_40 = (1 - n) * (int)ctemp._M_value;
      }
      else {
        local_40 = 0;
      }
      for (iy = 0; iy < n; iy = iy + 1) {
        _Var1 = cx[local_3c]._M_value;
        cx[local_3c]._M_value = stack0xffffffffffffffd8[local_40]._M_value;
        stack0xffffffffffffffd8[local_40]._M_value = _Var1;
        local_3c = local_3c + incx;
        local_40 = local_40 + (int)ctemp._M_value;
      }
    }
  }
  return;
}

Assistant:

void cswap ( int n, complex <float> cx[], int incx, complex <float> cy[],
  int incy )

//****************************************************************************80
//
//  Purpose:
//
//    CSWAP interchanges two vectors.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vectors.
//
//    Input/output, complex <float> CX[], one of the vectors to swap.
//
//    Input, int INCX, the increment between successive entries of CX.
//
//    Input/output, complex <float> CY[], one of the vectors to swap.
//
//    Input, int INCY, the increment between successive elements of CY.
//
{
  complex <float> ctemp;
  int i;
  int ix;
  int iy;

  if ( n <= 0 )
  {
    return;
  }

  if ( incx == 1 && incy == 1 )
  {
    for ( i = 0; i < n; i++ )
    {
      ctemp = cx[i];
      cx[i] = cy[i];
      cy[i] = ctemp;
    }
  }
  else
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      ctemp = cx[ix];
      cx[ix] = cy[iy];
      cy[iy] = ctemp;
      ix = ix + incx;
      iy = iy + incy;
    }
  }

  return;
}